

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::validateKTXmetalPixelFormat
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  uint32_t local_34;
  string local_30;
  
  this->foundKTXmetalPixelFormat = true;
  uVar1 = (this->header).vkFormat;
  local_34 = size;
  if (uVar1 != 0) {
    toString_abi_cxx11_(&local_30,(ktx *)(ulong)uVar1,size);
    error<std::__cxx11::string>(this,&Metadata::KTXmetalPixelFormatWithVkFormat,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_34 != 4) {
    error<unsigned_int&>(this,&Metadata::KTXmetalPixelFormatInvalidSize,&local_34);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXmetalPixelFormat(const uint8_t* data, uint32_t size) {
    (void) data;
    foundKTXmetalPixelFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXmetalPixelFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 4)
        error(Metadata::KTXmetalPixelFormatInvalidSize, size);
}